

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fse_decompress.c
# Opt level: O2

size_t FSE_decompress_wksp(void *dst,size_t dstCapacity,void *cSrc,size_t cSrcSize,
                          FSE_DTable *workSpace,uint maxLog)

{
  size_t sVar1;
  size_t sVar2;
  uint maxSymbolValue;
  uint tableLog;
  size_t local_240;
  short counting [256];
  
  maxSymbolValue = 0xff;
  local_240 = dstCapacity;
  sVar1 = FSE_readNCount(counting,&maxSymbolValue,&tableLog,cSrc,cSrcSize);
  sVar2 = sVar1;
  if (sVar1 < 0xffffffffffffff89) {
    if (maxLog < tableLog) {
      sVar2 = 0xffffffffffffffd4;
    }
    else {
      sVar2 = FSE_buildDTable(workSpace,counting,maxSymbolValue,tableLog);
      if (sVar2 < 0xffffffffffffff89) {
        sVar2 = FSE_decompress_usingDTable
                          (dst,local_240,(void *)((long)cSrc + sVar1),cSrcSize - sVar1,workSpace);
      }
    }
  }
  return sVar2;
}

Assistant:

size_t FSE_decompress_wksp(void* dst, size_t dstCapacity, const void* cSrc, size_t cSrcSize, FSE_DTable* workSpace, unsigned maxLog)
{
    const BYTE* const istart = (const BYTE*)cSrc;
    const BYTE* ip = istart;
    short counting[FSE_MAX_SYMBOL_VALUE+1];
    unsigned tableLog;
    unsigned maxSymbolValue = FSE_MAX_SYMBOL_VALUE;

    /* normal FSE decoding mode */
    size_t const NCountLength = FSE_readNCount (counting, &maxSymbolValue, &tableLog, istart, cSrcSize);
    if (FSE_isError(NCountLength)) return NCountLength;
    //if (NCountLength >= cSrcSize) return ERROR(srcSize_wrong);   /* too small input size; supposed to be already checked in NCountLength, only remaining case : NCountLength==cSrcSize */
    if (tableLog > maxLog) return ERROR(tableLog_tooLarge);
    ip += NCountLength;
    cSrcSize -= NCountLength;

    CHECK_F( FSE_buildDTable (workSpace, counting, maxSymbolValue, tableLog) );

    return FSE_decompress_usingDTable (dst, dstCapacity, ip, cSrcSize, workSpace);   /* always return, even if it is an error code */
}